

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMemSetRowSet(Mem *pMem)

{
  sqlite3 *db;
  u16 uVar1;
  uint uVar2;
  char *pcVar3;
  RowSet *p;
  
  db = pMem->db;
  sqlite3VdbeMemRelease(pMem);
  pcVar3 = (char *)sqlite3DbMallocRawNN(db,0x40);
  pMem->zMalloc = pcVar3;
  if (db->mallocFailed == '\0') {
    uVar2 = sqlite3DbMallocSize(db,pcVar3);
    pMem->szMalloc = uVar2;
    pcVar3 = pMem->zMalloc;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    *(sqlite3 **)(pcVar3 + 8) = db;
    pcVar3[0x28] = '\0';
    pcVar3[0x29] = '\0';
    pcVar3[0x2a] = '\0';
    pcVar3[0x2b] = '\0';
    pcVar3[0x2c] = '\0';
    pcVar3[0x2d] = '\0';
    pcVar3[0x2e] = '\0';
    pcVar3[0x2f] = '\0';
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\0';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    *(char **)(pcVar3 + 0x20) = pcVar3 + 0x38;
    *(short *)(pcVar3 + 0x30) = (short)(((ulong)uVar2 - 0x38) / 0x18);
    pcVar3[0x32] = '\x01';
    pcVar3[0x33] = '\0';
    pcVar3[0x34] = '\0';
    pcVar3[0x35] = '\0';
    pcVar3[0x36] = '\0';
    pcVar3[0x37] = '\0';
    (pMem->u).zPType = pcVar3;
    uVar1 = 0x20;
  }
  else {
    pMem->szMalloc = 0;
    uVar1 = 1;
  }
  pMem->flags = uVar1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetRowSet(Mem *pMem){
  sqlite3 *db = pMem->db;
  assert( db!=0 );
  assert( (pMem->flags & MEM_RowSet)==0 );
  sqlite3VdbeMemRelease(pMem);
  pMem->zMalloc = sqlite3DbMallocRawNN(db, 64);
  if( db->mallocFailed ){
    pMem->flags = MEM_Null;
    pMem->szMalloc = 0;
  }else{
    assert( pMem->zMalloc );
    pMem->szMalloc = sqlite3DbMallocSize(db, pMem->zMalloc);
    pMem->u.pRowSet = sqlite3RowSetInit(db, pMem->zMalloc, pMem->szMalloc);
    assert( pMem->u.pRowSet!=0 );
    pMem->flags = MEM_RowSet;
  }
}